

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O3

PmError alsa_write_flush(PmInternal *midi,PmTimestamp timestamp)

{
  void *pvVar1;
  PmError PVar2;
  
  pvVar1 = midi->descriptor;
  if (pvVar1 == (void *)0x0) {
    PVar2 = pmBadPtr;
  }
  else {
    PVar2 = snd_seq_drain_output(seq);
    *(PmError *)((long)pvVar1 + 0x18) = PVar2 & PVar2 >> 0x1f;
    PVar2 = PVar2 >> 0x1f & pmHostError;
  }
  return PVar2;
}

Assistant:

static PmError alsa_write_flush(PmInternal *midi, PmTimestamp timestamp)
{
    alsa_descriptor_type desc = (alsa_descriptor_type) midi->descriptor;
    if (!desc) return pmBadPtr;
    VERBOSE printf("snd_seq_drain_output: 0x%p\n", seq);
    desc->error = snd_seq_drain_output(seq);
    if (desc->error < 0) return pmHostError;

    desc->error = pmNoError;
    return pmNoError;
}